

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

void __thiscall
QDeviceDiscoveryUDev::QDeviceDiscoveryUDev
          (QDeviceDiscoveryUDev *this,QDeviceTypes types,udev *udev,QObject *parent)

{
  int iVar1;
  long lVar2;
  QSocketNotifier *this_00;
  long in_FS_OFFSET;
  QObject local_50 [8];
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDeviceDiscovery::QDeviceDiscovery((QDeviceDiscovery *)this,types,parent);
  *(undefined ***)this = &PTR_metaObject_00150f98;
  *(udev **)(this + 0x18) = udev;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  if (udev != (udev *)0x0) {
    lVar2 = udev_monitor_new_from_netlink(udev,"udev");
    *(long *)(this + 0x20) = lVar2;
    if (lVar2 == 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_30 = "default";
      QMessageLogger::warning
                (local_48,"Unable to create an udev monitor. No devices can be detected.");
    }
    else {
      udev_monitor_filter_add_match_subsystem_devtype(lVar2,"input",0);
      udev_monitor_filter_add_match_subsystem_devtype(*(undefined8 *)(this + 0x20),"drm",0);
      udev_monitor_enable_receiving(*(undefined8 *)(this + 0x20));
      iVar1 = udev_monitor_get_fd(*(undefined8 *)(this + 0x20));
      *(int *)(this + 0x28) = iVar1;
      this_00 = (QSocketNotifier *)operator_new(0x10);
      QSocketNotifier::QSocketNotifier(this_00,(long)iVar1,Read,(QObject *)this);
      *(QSocketNotifier **)(this + 0x30) = this_00;
      QObject::connect(local_50,(char *)this_00,(QObject *)"2activated(QSocketDescriptor)",
                       (char *)this,0x13ea81);
      QMetaObject::Connection::~Connection((Connection *)local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDeviceDiscoveryUDev::QDeviceDiscoveryUDev(QDeviceTypes types, struct udev *udev, QObject *parent) :
    QDeviceDiscovery(types, parent),
    m_udev(udev)
{
    if (!m_udev)
        return;

    m_udevMonitor = udev_monitor_new_from_netlink(m_udev, "udev");
    if (!m_udevMonitor) {
        qWarning("Unable to create an udev monitor. No devices can be detected.");
        return;
    }

    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "input", 0);
    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "drm", 0);
    udev_monitor_enable_receiving(m_udevMonitor);
    m_udevMonitorFileDescriptor = udev_monitor_get_fd(m_udevMonitor);

    m_udevSocketNotifier = new QSocketNotifier(m_udevMonitorFileDescriptor, QSocketNotifier::Read, this);
    connect(m_udevSocketNotifier, SIGNAL(activated(QSocketDescriptor)), this, SLOT(handleUDevNotification()));
}